

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2f151d::VendorExtQualType::printLeft(VendorExtQualType *this,OutputStream *S)

{
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  VendorExtQualType *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  Node::print(this->Ty,S);
  StringView::StringView(&local_28," ");
  OutputStream::operator+=(local_18,local_28);
  OutputStream::operator+=(local_18,this->Ext);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    Ty->print(S);
    S += " ";
    S += Ext;
  }